

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrMan.c
# Opt level: O3

void Rwr_ManStop(Rwr_Man_t *p)

{
  void *__ptr;
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  Vec_Int_t *__ptr_00;
  int *__ptr_01;
  ulong uVar3;
  void *pvVar4;
  long lVar5;
  Vec_Vec_t *__ptr_02;
  long lVar6;
  
  __ptr_02 = p->vClasses;
  if (__ptr_02 != (Vec_Vec_t *)0x0) {
    uVar3 = (ulong)(uint)__ptr_02->nSize;
    if (0 < __ptr_02->nSize) {
      lVar6 = 0;
      do {
        if ((int)uVar3 <= lVar6) {
LAB_004cb824:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                        ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
        }
        pvVar4 = __ptr_02->pArray[lVar6];
        if (0 < *(int *)((long)pvVar4 + 4)) {
          lVar5 = 0;
          do {
            pvVar4 = *(void **)(*(long *)(*(long *)((long)pvVar4 + 8) + lVar5 * 8) + 0x28);
            __ptr = *(void **)((long)pvVar4 + 0x10);
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
            free(pvVar4);
            __ptr_02 = p->vClasses;
            uVar3 = (ulong)__ptr_02->nSize;
            if ((long)uVar3 <= lVar6) goto LAB_004cb824;
            lVar5 = lVar5 + 1;
            pvVar4 = __ptr_02->pArray[lVar6];
          } while (lVar5 < *(int *)((long)pvVar4 + 4));
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < (int)uVar3);
      if (0 < (int)uVar3) {
        lVar6 = 0;
        do {
          pvVar4 = __ptr_02->pArray[lVar6];
          if (pvVar4 != (void *)0x0) {
            if (*(void **)((long)pvVar4 + 8) != (void *)0x0) {
              free(*(void **)((long)pvVar4 + 8));
            }
            free(pvVar4);
            uVar3 = (ulong)(uint)__ptr_02->nSize;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < (int)uVar3);
      }
    }
    if (__ptr_02->pArray != (void **)0x0) {
      free(__ptr_02->pArray);
    }
    free(__ptr_02);
  }
  pVVar1 = p->vNodesTemp;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  pVVar1 = p->vForest;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  __ptr_00 = p->vLevNums;
  __ptr_01 = __ptr_00->pArray;
  if (__ptr_01 != (int *)0x0) {
    free(__ptr_01);
  }
  free(__ptr_00);
  pVVar1 = p->vFanins;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  pVVar1 = p->vFaninsCur;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  Extra_MmFixedStop(p->pMmNode);
  if (p->pMapInv != (unsigned_short *)0x0) {
    free(p->pMapInv);
    p->pMapInv = (unsigned_short *)0x0;
  }
  if (p->pTable != (Rwr_Node_t **)0x0) {
    free(p->pTable);
    p->pTable = (Rwr_Node_t **)0x0;
  }
  if (p->pPractical != (char *)0x0) {
    free(p->pPractical);
    p->pPractical = (char *)0x0;
  }
  if (p->pPerms4 != (char **)0x0) {
    free(p->pPerms4);
  }
  free(p);
  return;
}

Assistant:

void Rwr_ManStop( Rwr_Man_t * p )
{
    if ( p->vClasses )
    {
        Rwr_Node_t * pNode;
        int i, k;
        Vec_VecForEachEntry( Rwr_Node_t *, p->vClasses, pNode, i, k )
            Dec_GraphFree( (Dec_Graph_t *)pNode->pNext );
    }
    if ( p->vClasses )  Vec_VecFree( p->vClasses );
    Vec_PtrFree( p->vNodesTemp );
    Vec_PtrFree( p->vForest );
    Vec_IntFree( p->vLevNums );
    Vec_PtrFree( p->vFanins );
    Vec_PtrFree( p->vFaninsCur );
    Extra_MmFixedStop( p->pMmNode );
    ABC_FREE( p->pMapInv );
    ABC_FREE( p->pTable );
    ABC_FREE( p->pPractical );
    ABC_FREE( p->pPerms4 );
    ABC_FREE( p );
}